

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O2

void can_strip_multiple_mixed_parameters_to_leave_original_names(void)

{
  char *pcVar1;
  Constraint *pCVar2;
  
  names = (CgreenVector *)create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
  pcVar1 = (char *)cgreen_vector_get(names,0);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("a","\"a\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x74,"(const char *)cgreen_vector_get(names, 0)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,1);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("b","\"b\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x75,"(const char *)cgreen_vector_get(names, 1)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,2);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("c","\"c\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x76,"(const char *)cgreen_vector_get(names, 2)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,3);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("d","\"d\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x77,"(const char *)cgreen_vector_get(names, 3)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,4);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("e","\"e\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x78,"(const char *)cgreen_vector_get(names, 4)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,5);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("f","\"f\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x79,"(const char *)cgreen_vector_get(names, 5)",pcVar1,pCVar2);
  pcVar1 = (char *)cgreen_vector_get(names,6);
  pCVar2 = (Constraint *)create_equal_to_string_constraint("g","\"g\"");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x7a,"(const char *)cgreen_vector_get(names, 6)",pcVar1,pCVar2);
  return;
}

Assistant:

Ensure(can_strip_multiple_mixed_parameters_to_leave_original_names) {
    names = create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
    assert_that((const char *)cgreen_vector_get(names, 0), is_equal_to_string("a"));
    assert_that((const char *)cgreen_vector_get(names, 1), is_equal_to_string("b"));
    assert_that((const char *)cgreen_vector_get(names, 2), is_equal_to_string("c"));
    assert_that((const char *)cgreen_vector_get(names, 3), is_equal_to_string("d"));
    assert_that((const char *)cgreen_vector_get(names, 4), is_equal_to_string("e"));
    assert_that((const char *)cgreen_vector_get(names, 5), is_equal_to_string("f"));
    assert_that((const char *)cgreen_vector_get(names, 6), is_equal_to_string("g"));
}